

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md32_common.h
# Opt level: O0

void crypto_md32_final(crypto_md32_block_func block_func,uint32_t *h,uint8_t *data,size_t block_size
                      ,uint *num,uint32_t Nh,uint32_t Nl,int is_big_endian)

{
  ulong local_40;
  size_t n;
  uint32_t Nh_local;
  uint *num_local;
  size_t block_size_local;
  uint8_t *data_local;
  uint32_t *h_local;
  crypto_md32_block_func block_func_local;
  
  local_40 = (ulong)*num;
  if (local_40 < block_size) {
    data[local_40] = 0x80;
    local_40 = local_40 + 1;
    if (block_size - 8 < local_40) {
      OPENSSL_memset(data + local_40,0,block_size - local_40);
      local_40 = 0;
      (*block_func)(h,data,1);
    }
    OPENSSL_memset(data + local_40,0,(block_size - 8) - local_40);
    if (is_big_endian == 0) {
      CRYPTO_store_u32_le(data + (block_size - 8),Nl);
      CRYPTO_store_u32_le(data + (block_size - 4),Nh);
    }
    else {
      CRYPTO_store_u32_be(data + (block_size - 8),Nh);
      CRYPTO_store_u32_be(data + (block_size - 4),Nl);
    }
    (*block_func)(h,data,1);
    *num = 0;
    OPENSSL_memset(data,0,block_size);
    return;
  }
  __assert_fail("n < block_size",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/sha/../digest/md32_common.h"
                ,0x83,
                "void crypto_md32_final(crypto_md32_block_func, uint32_t *, uint8_t *, size_t, unsigned int *, uint32_t, uint32_t, int)"
               );
}

Assistant:

static inline void crypto_md32_final(crypto_md32_block_func block_func,
                                     uint32_t *h, uint8_t *data,
                                     size_t block_size, unsigned *num,
                                     uint32_t Nh, uint32_t Nl,
                                     int is_big_endian) {
  // |data| always has room for at least one byte. A full block would have
  // been consumed.
  size_t n = *num;
  assert(n < block_size);
  data[n] = 0x80;
  n++;

  // Fill the block with zeros if there isn't room for a 64-bit length.
  if (n > block_size - 8) {
    OPENSSL_memset(data + n, 0, block_size - n);
    n = 0;
    block_func(h, data, 1);
  }
  OPENSSL_memset(data + n, 0, block_size - 8 - n);

  // Append a 64-bit length to the block and process it.
  if (is_big_endian) {
    CRYPTO_store_u32_be(data + block_size - 8, Nh);
    CRYPTO_store_u32_be(data + block_size - 4, Nl);
  } else {
    CRYPTO_store_u32_le(data + block_size - 8, Nl);
    CRYPTO_store_u32_le(data + block_size - 4, Nh);
  }
  block_func(h, data, 1);
  *num = 0;
  OPENSSL_memset(data, 0, block_size);
}